

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O2

void Error::setErrorString(String *error)

{
  Str *pSVar1;
  Item *pIVar2;
  code *pcVar3;
  uint *puVar4;
  Iterator IVar5;
  int iVar6;
  long lVar7;
  int *piVar8;
  Str *this;
  Iterator i;
  uint32 threadId;
  cpu_set_t cpuset;
  Item *local_c8;
  uint local_bc;
  String *local_b8;
  cpu_set_t local_b0;
  
  local_b8 = error;
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)&Private::mutex);
  if ((iVar6 == 0) ||
     (iVar6 = Debug::printf("%s:%u: verification failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Error.cpp"
                            ,0xa4,"pthread_mutex_lock(&Private::mutex) == 0"), iVar6 == 0)) {
    lVar7 = syscall(0xba);
    IVar5 = Private::userErrorStrings._end;
    local_c8 = Private::userErrorStrings._begin.item;
    this = (Str *)0x0;
    local_bc = (uint)lVar7;
    while (local_c8 != IVar5.item) {
      pIVar2 = local_c8->next;
      iVar6 = sched_getaffinity(local_c8->key,0x80,&local_b0);
      if (iVar6 == 0) {
        pSVar1 = &local_c8->value;
        puVar4 = &local_c8->key;
        local_c8 = pIVar2;
        if (*puVar4 == (uint)lVar7) {
          this = pSVar1;
        }
      }
      else {
        Map<unsigned_int,_Error::Private::Str>::remove(&Private::userErrorStrings,(char *)&local_c8)
        ;
        local_c8 = pIVar2;
      }
    }
    if (this == (Str *)0x0) {
      Private::Str::Str((Str *)&local_b0,local_b8);
      Map<unsigned_int,_Error::Private::Str>::insert
                (&Private::userErrorStrings,&local_bc,(Str *)&local_b0);
    }
    else {
      Private::Str::Str((Str *)&local_b0,local_b8);
      Private::Str::operator=(this,(Str *)&local_b0);
    }
    Private::Str::~Str((Str *)&local_b0);
    piVar8 = __errno_location();
    *piVar8 = 0x10000;
    iVar6 = pthread_mutex_unlock((pthread_mutex_t *)&Private::mutex);
    if ((iVar6 == 0) ||
       (iVar6 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Error.cpp"
                              ,0xcf,"pthread_mutex_unlock(&Private::mutex) == 0"), iVar6 == 0)) {
      return;
    }
  }
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

void Error::setErrorString(const String& error)
{
#ifdef _WIN32
  EnterCriticalSection(&Private::cs);
#else
  VERIFY(pthread_mutex_lock(&Private::mutex) == 0);
#endif

#ifdef _WIN32
  uint32 threadId = (uint32)GetCurrentThreadId();
#else
  uint32 threadId = (uint32)syscall(__NR_gettid);
#endif

  Error::Private::Str* threadErrorMsg = 0;
  for(Map<uint32, Error::Private::Str>::Iterator i = Private::userErrorStrings.begin(), end = Private::userErrorStrings.end(), next; i != end; i = next)
  {
    next = i;
    ++next;

#ifdef _WIN32
    HANDLE handle = OpenThread(DELETE, FALSE, i.key());
    if(handle == NULL)
    {
      Private::userErrorStrings.remove(i);
      continue;
    }
    else
      CloseHandle(handle);
#else
    cpu_set_t cpuset;
    if(sched_getaffinity((pid_t)i.key(), sizeof(cpu_set_t), &cpuset) != 0)
    {
      Private::userErrorStrings.remove(i);
      continue;
    }
#endif
    if(i.key() == threadId)
      threadErrorMsg = &*i;
  }
  if(threadErrorMsg)
    *threadErrorMsg = error;
  else
    Private::userErrorStrings.insert(threadId, error);
  setLastError(0x10000);
#ifdef _WIN32
  LeaveCriticalSection(&Private::cs);
#else
  VERIFY(pthread_mutex_unlock(&Private::mutex) == 0);
#endif
}